

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_stroke_rect
               (nk_draw_list *list,nk_rect rect,nk_color col,float rounding,float thickness)

{
  nk_vec2 a;
  nk_vec2 b;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x27c5,
                  "void nk_draw_list_stroke_rect(struct nk_draw_list *, struct nk_rect, struct nk_color, float, float)"
                 );
  }
  if ((uint)col < 0x1000000) {
    return;
  }
  if (list->line_AA == NK_ANTI_ALIASING_ON) {
    a = rect._0_8_;
  }
  else {
    a.x = rect.x + -0.5;
    a.y = rect.y + -0.5;
  }
  b.y = rect.h + rect.y;
  b.x = rect.x + rect.w;
  nk_draw_list_path_rect_to(list,a,b,rounding);
  nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_rect(struct nk_draw_list *list, struct nk_rect rect,
    struct nk_color col, float rounding, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
        nk_draw_list_path_rect_to(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
    } else {
        nk_draw_list_path_rect_to(list, nk_vec2(rect.x-0.5f, rect.y-0.5f),
            nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
    } nk_draw_list_path_stroke(list,  col, NK_STROKE_CLOSED, thickness);
}